

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O3

void lzma_check_update(lzma_check_state *check,lzma_check type,uint8_t *buf,size_t size)

{
  uint32_t uVar1;
  uint64_t uVar2;
  
  if (type != LZMA_CHECK_SHA256) {
    if (type == LZMA_CHECK_CRC64) {
      uVar2 = lzma_crc64(buf,size,(check->state).crc64);
      (check->state).crc64 = uVar2;
    }
    else if (type == LZMA_CHECK_CRC32) {
      uVar1 = lzma_crc32(buf,size,(check->state).crc32);
      (check->state).crc32 = uVar1;
    }
    return;
  }
  lzma_sha256_update(buf,size,check);
  return;
}

Assistant:

extern void
lzma_check_update(lzma_check_state *check, lzma_check type,
		const uint8_t *buf, size_t size)
{
	switch (type) {
#ifdef HAVE_CHECK_CRC32
	case LZMA_CHECK_CRC32:
		check->state.crc32 = lzma_crc32(buf, size, check->state.crc32);
		break;
#endif

#ifdef HAVE_CHECK_CRC64
	case LZMA_CHECK_CRC64:
		check->state.crc64 = lzma_crc64(buf, size, check->state.crc64);
		break;
#endif

#ifdef HAVE_CHECK_SHA256
	case LZMA_CHECK_SHA256:
		lzma_sha256_update(buf, size, check);
		break;
#endif

	default:
		break;
	}

	return;
}